

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O1

IntrinsicResult intrinsic_fclose(Context *context,IntrinsicResult partialResult)

{
  ValueType VVar1;
  anon_union_8_3_2f476f46_for_data aVar2;
  ListStorage<MiniScript::TACLine> *pLVar3;
  long *plVar4;
  undefined4 *puVar5;
  Value fileWrapper;
  Value self;
  Value local_78;
  Value local_68;
  Value local_58;
  long *local_48;
  char local_40;
  undefined1 local_38 [32];
  
  local_40 = '\0';
  plVar4 = (long *)operator_new(0x30);
  plVar4[1] = 1;
  *plVar4 = (long)&PTR__StringStorage_001d10b0;
  plVar4[3] = 5;
  plVar4[4] = -1;
  puVar5 = (undefined4 *)operator_new__(5);
  plVar4[2] = (long)puVar5;
  *(undefined1 *)(puVar5 + 1) = 0;
  *puVar5 = 0x666c6573;
  local_48 = plVar4;
  MiniScript::Context::GetVar
            ((Context *)local_38,(String *)partialResult.rs,(LocalOnlyMode)&local_48);
  if ((local_48 != (long *)0x0) && (local_40 == '\0')) {
    plVar4 = local_48 + 1;
    *plVar4 = *plVar4 + -1;
    if (*plVar4 == 0) {
      (**(code **)(*local_48 + 8))();
    }
    local_48 = (long *)0x0;
  }
  aVar2 = _handle.data;
  VVar1 = _handle.type;
  if ((Temp < _handle.type) && (_handle.data.ref != (RefCountedStorage *)0x0)) {
    (_handle.data.ref)->refCount = (_handle.data.ref)->refCount + 1;
  }
  MiniScript::Value::Lookup(&local_58,(Value *)local_38);
  if ((Temp < VVar1) && (aVar2.ref != (RefCountedStorage *)0x0)) {
    plVar4 = &(aVar2.ref)->refCount;
    *plVar4 = *plVar4 + -1;
    if (*plVar4 == 0) {
      (*(aVar2.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  aVar2 = local_58.data;
  if (local_58.type == Handle) {
    if ((FILE *)local_58.data.ref[1]._vptr_RefCountedStorage == (FILE *)0x0) {
      local_68.type = MiniScript::Value::zero;
      local_68.noInvoke = DAT_001d32e1;
      local_68.localOnly = DAT_001d32e2;
      local_68.data.ref = DAT_001d32e8;
      if ((Temp < MiniScript::Value::zero) && (DAT_001d32e8 != (RefCountedStorage *)0x0)) {
        DAT_001d32e8->refCount = DAT_001d32e8->refCount + 1;
      }
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      MiniScript::Value::operator=
                ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                 &local_68);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((Temp < local_68.type) && (local_68.data.ref != (RefCountedStorage *)0x0)) {
        plVar4 = &(local_68.data.ref)->refCount;
        *plVar4 = *plVar4 + -1;
        if (*plVar4 == 0) {
          (*(local_68.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_68.data.number = 0.0;
      }
    }
    else {
      fclose((FILE *)local_58.data.ref[1]._vptr_RefCountedStorage);
      aVar2.ref[1]._vptr_RefCountedStorage = (_func_int **)0x0;
      local_78.type = MiniScript::Value::one;
      local_78.noInvoke = DAT_001d32f1;
      local_78.localOnly = DAT_001d32f2;
      local_78.data.ref = DAT_001d32f8;
      if ((Temp < MiniScript::Value::one) && (DAT_001d32f8 != (RefCountedStorage *)0x0)) {
        DAT_001d32f8->refCount = DAT_001d32f8->refCount + 1;
      }
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      MiniScript::Value::operator=
                ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                 &local_78);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((Temp < local_78.type) && (local_78.data.ref != (RefCountedStorage *)0x0)) {
        plVar4 = &(local_78.data.ref)->refCount;
        *plVar4 = *plVar4 + -1;
        if (*plVar4 == 0) {
          (*(local_78.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_78.data.number = 0.0;
      }
    }
  }
  else {
    MiniScript::IntrinsicResult::ensureStorage
              ((IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
    pLVar3 = MiniScript::IntrinsicResult::Null;
    (context->code).ls = MiniScript::IntrinsicResult::Null;
    if (pLVar3 != (ListStorage<MiniScript::TACLine> *)0x0) {
      plVar4 = &(pLVar3->super_RefCountedStorage).refCount;
      *plVar4 = *plVar4 + 1;
    }
  }
  if ((Temp < local_58.type) && (local_58.data.ref != (RefCountedStorage *)0x0)) {
    plVar4 = &(local_58.data.ref)->refCount;
    *plVar4 = *plVar4 + -1;
    if (*plVar4 == 0) {
      (*(local_58.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_58.data.number = 0.0;
  }
  if ((Temp < local_38[0]) && ((RefCountedStorage *)local_38._8_8_ != (RefCountedStorage *)0x0)) {
    plVar4 = (long *)(local_38._8_8_ + 8);
    *plVar4 = *plVar4 + -1;
    if (*plVar4 == 0) {
      (*(*(_func_int ***)local_38._8_8_)[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_fclose(Context *context, IntrinsicResult partialResult) {
	Value self = context->GetVar("self");
	Value fileWrapper = self.Lookup(_handle);
	if (fileWrapper.IsNull() or fileWrapper.type != ValueType::Handle) return IntrinsicResult::Null;
	FileHandleStorage *storage = (FileHandleStorage*)fileWrapper.data.ref;
	FILE *handle = storage->f;
	if (handle == nullptr) return IntrinsicResult(Value::zero);
	fclose(handle);
	storage->f = nullptr;
	return IntrinsicResult(Value::one);
}